

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O1

Vec_Int_t * Io_ReadFins(Abc_Ntk_t *pNtk,char *pFileName,int fVerbose)

{
  Mio_Library_t *pMVar1;
  Abc_Obj_t *pObj;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  Abc_Nam_t *p;
  Vec_Int_t *p_00;
  int *piVar6;
  Vec_Ptr_t *pVVar7;
  char *pcVar8;
  Vec_Int_t *p_01;
  char *pcVar9;
  undefined4 uVar10;
  ulong uVar11;
  long lVar12;
  int fFound;
  char Buffer [1000];
  int local_434;
  Abc_Nam_t *local_430;
  Mio_Library_t *local_428;
  char *local_420;
  char local_418 [1000];
  
  pMVar1 = (Mio_Library_t *)pNtk->pManFunc;
  __stream = fopen(pFileName,"r");
  if (__stream == (FILE *)0x0) {
    p_01 = (Vec_Int_t *)0x0;
    printf("Cannot open input file \"%s\" for reading.\n",pFileName);
  }
  else {
    local_428 = pMVar1;
    local_420 = pFileName;
    p = Abc_NamStart(1000,10);
    p_00 = (Vec_Int_t *)malloc(0x10);
    p_00->nCap = 1000;
    p_00->nSize = 0;
    piVar6 = (int *)malloc(4000);
    p_00->pArray = piVar6;
    Vec_IntPush(p_00,-1);
    pVVar7 = pNtk->vObjs;
    local_430 = p;
    if (0 < pVVar7->nSize) {
      lVar12 = 0;
      do {
        pObj = (Abc_Obj_t *)pVVar7->pArray[lVar12];
        if (((pObj != (Abc_Obj_t *)0x0) && (uVar2 = *(uint *)&pObj->field_0x14 & 0xf, uVar2 < 8)) &&
           ((0xa4U >> uVar2 & 1) != 0)) {
          pcVar8 = Abc_ObjName(pObj);
          Abc_NamStrFindOrAdd(p,pcVar8,&local_434);
          if (local_434 != 0) {
            pcVar8 = Abc_ObjName(pObj);
            p_01 = (Vec_Int_t *)0x0;
            printf("The same name \"%s\" appears twice among CIs and internal nodes.\n",pcVar8);
            goto switchD_002b13e4_caseD_5;
          }
          Vec_IntPush(p_00,pObj->Id);
        }
        lVar12 = lVar12 + 1;
        pVVar7 = pNtk->vObjs;
      } while (lVar12 < pVVar7->nSize);
    }
    iVar5 = p_00->nSize;
    iVar3 = Abc_NamObjNumMax(p);
    if (iVar5 != iVar3) {
      __assert_fail("Vec_IntSize(vMap) == Abc_NamObjNumMax(pNam)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDetect.c"
                    ,0xc3,"Vec_Int_t *Io_ReadFins(Abc_Ntk_t *, char *, int)");
    }
    p_01 = (Vec_Int_t *)malloc(0x10);
    p_01->nCap = 1000;
    p_01->nSize = 0;
    piVar6 = (int *)malloc(4000);
    p_01->pArray = piVar6;
    Vec_IntPush(p_01,-1);
    Vec_IntPush(p_01,-1);
    pcVar8 = fgets(local_418,1000,__stream);
    if (pcVar8 != (char *)0x0) {
      iVar5 = 1;
LAB_002b1214:
      pcVar8 = strtok(local_418," \n\r\t");
      if (pcVar8 == (char *)0x0) {
        uVar10 = 7;
        iVar3 = iVar5;
      }
      else {
        iVar3 = iVar5 + 1;
        iVar4 = atoi(pcVar8);
        if (iVar5 == iVar4) {
          pcVar8 = strtok((char *)0x0," \n\r\t");
          uVar2 = Abc_NamStrFind(local_430,pcVar8);
          if (uVar2 == 0) {
            printf("Cannot find object with name \"%s\".\n",pcVar8);
          }
          else {
            pcVar8 = strtok((char *)0x0," \n\r\t");
            if (((pNtk->ntkFunc == ABC_FUNC_MAP) && (pNtk->ntkType == ABC_NTK_LOGIC)) &&
               ((iVar5 = strcmp(pcVar8,"SA0"), iVar5 != 0 &&
                ((iVar5 = strcmp(pcVar8,"SA1"), iVar5 != 0 &&
                 (iVar5 = strcmp(pcVar8,"NEG"), iVar5 != 0)))))) {
              iVar5 = Io_ReadFinTypeMapped(local_428,pcVar8);
            }
            else {
              iVar5 = Io_ReadFinType(pcVar8);
            }
            if (iVar5 != -100) {
              if (((int)uVar2 < 0) || (p_00->nSize <= (int)uVar2)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              Vec_IntPush(p_01,p_00->pArray[uVar2]);
              Vec_IntPush(p_01,iVar5);
              uVar10 = 0;
              goto LAB_002b13cb;
            }
            if (((int)uVar2 < 0) || (pNtk->vObjs->nSize <= (int)uVar2)) goto LAB_002b1560;
            pcVar9 = Abc_ObjName((Abc_Obj_t *)pNtk->vObjs->pArray[uVar2]);
            printf("Cannot read type \"%s\" of object \"%s\".\n",pcVar8,pcVar9);
          }
          uVar10 = 6;
        }
        else {
          puts("Line numbers are not consecutive. Quitting.");
          uVar10 = 5;
          if (p_01 != (Vec_Int_t *)0x0) {
            if (p_01->pArray != (int *)0x0) {
              free(p_01->pArray);
              p_01->pArray = (int *)0x0;
            }
            free(p_01);
            p_01 = (Vec_Int_t *)0x0;
          }
        }
      }
LAB_002b13cb:
      switch(uVar10) {
      case 0:
      case 6:
        goto switchD_002b13e4_caseD_0;
      default:
        return p_01;
      case 5:
        goto switchD_002b13e4_caseD_5;
      case 7:
        goto switchD_002b13e4_caseD_7;
      }
    }
    iVar3 = 1;
switchD_002b13e4_caseD_7:
    if (p_01->nSize != iVar3 * 2) {
      __assert_fail("Vec_IntSize(vPairs) == 2 * nLines",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDetect.c"
                    ,0xed,"Vec_Int_t *Io_ReadFins(Abc_Ntk_t *, char *, int)");
    }
    printf("Finished reading %d lines from the fault list file \"%s\".\n",(ulong)(iVar3 - 1),
           local_420);
    if ((fVerbose != 0) && (3 < p_01->nSize)) {
      uVar11 = 2;
      iVar5 = 3;
      do {
        iVar3 = p_01->pArray[uVar11];
        if (((long)iVar3 < 0) || (pNtk->vObjs->nSize <= iVar3)) {
LAB_002b1560:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        iVar4 = p_01->pArray[uVar11 + 1];
        pcVar9 = Abc_ObjName((Abc_Obj_t *)pNtk->vObjs->pArray[iVar3]);
        uVar2 = iVar4 + 99;
        pcVar8 = "Unknown";
        if (uVar2 < 0xb) {
          pcVar8 = *(char **)(&DAT_00bc8e70 + (ulong)uVar2 * 8);
        }
        printf("%-10d%-10s%-10s\n",uVar11 >> 1 & 0x7fffffff,pcVar9,pcVar8);
        uVar11 = uVar11 + 2;
        iVar5 = iVar5 + 2;
      } while (iVar5 < p_01->nSize);
switchD_002b13e4_caseD_5:
    }
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
      p_00->pArray = (int *)0x0;
    }
    free(p_00);
    Abc_NamDeref(local_430);
    fclose(__stream);
  }
  return p_01;
switchD_002b13e4_caseD_0:
  pcVar8 = fgets(local_418,1000,__stream);
  iVar5 = iVar3;
  if (pcVar8 == (char *)0x0) goto switchD_002b13e4_caseD_7;
  goto LAB_002b1214;
}

Assistant:

Vec_Int_t * Io_ReadFins( Abc_Ntk_t * pNtk, char * pFileName, int fVerbose )
{
    Mio_Library_t * pLib = (Mio_Library_t *)pNtk->pManFunc;
    char Buffer[1000];
    Abc_Obj_t * pObj;
    Abc_Nam_t * pNam;
    Vec_Int_t * vMap; 
    Vec_Int_t * vPairs = NULL;
    int i, Type, iObj, fFound, nLines = 1;
    FILE * pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Cannot open input file \"%s\" for reading.\n", pFileName );
        return NULL;
    }
    // map CI/node names into their IDs
    pNam = Abc_NamStart( 1000, 10 );
    vMap = Vec_IntAlloc( 1000 );
    Vec_IntPush( vMap, -1 );
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( !Abc_ObjIsCi(pObj) && !Abc_ObjIsNode(pObj) )
            continue;
        Abc_NamStrFindOrAdd( pNam, Abc_ObjName(pObj), &fFound );
        if ( fFound )
        {
            printf( "The same name \"%s\" appears twice among CIs and internal nodes.\n", Abc_ObjName(pObj) );
            goto finish;
        }
        Vec_IntPush( vMap, Abc_ObjId(pObj) );
    }
    assert( Vec_IntSize(vMap) == Abc_NamObjNumMax(pNam) );
    // read file lines
    vPairs = Vec_IntAlloc( 1000 );
    Vec_IntPushTwo( vPairs, -1, -1 );
    while ( fgets(Buffer, 1000, pFile) != NULL )
    {
        // read line number
        char * pToken = strtok( Buffer, " \n\r\t" );
        if ( pToken == NULL )
            break;
        if ( nLines++ != atoi(pToken) )
        {
            printf( "Line numbers are not consecutive. Quitting.\n" );
            Vec_IntFreeP( &vPairs );
            goto finish;
        }
        // read object name and find its ID
        pToken = strtok( NULL, " \n\r\t" );
        iObj = Abc_NamStrFind( pNam, pToken );
        if ( !iObj )
        {
            printf( "Cannot find object with name \"%s\".\n", pToken );
            continue;
        }
        // read type
        pToken = strtok( NULL, " \n\r\t" );
        if ( Abc_NtkIsMappedLogic(pNtk) )
        {
            if ( !strcmp(pToken, "SA0") || !strcmp(pToken, "SA1") || !strcmp(pToken, "NEG") )
                Type = Io_ReadFinType( pToken );
            else
                Type = Io_ReadFinTypeMapped( pLib, pToken );
        }
        else
            Type = Io_ReadFinType( pToken );
        if ( Type == ABC_FIN_NONE )
        {
            printf( "Cannot read type \"%s\" of object \"%s\".\n", pToken, Abc_ObjName(Abc_NtkObj(pNtk, iObj)) );
            continue;
        }
        Vec_IntPushTwo( vPairs, Vec_IntEntry(vMap, iObj), Type );
    }
    assert( Vec_IntSize(vPairs) == 2 * nLines );
    printf( "Finished reading %d lines from the fault list file \"%s\".\n", nLines - 1, pFileName );

    // verify the reader by printing the results
    if ( fVerbose )
        Vec_IntForEachEntryDoubleStart( vPairs, iObj, Type, i, 2 )
            printf( "%-10d%-10s%-10s\n", i/2, Abc_ObjName(Abc_NtkObj(pNtk, iObj)), Io_WriteFinType(Type) );

finish:
    Vec_IntFree( vMap );
    Abc_NamDeref( pNam );
    fclose( pFile );
    return vPairs;
}